

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderPackingFunctionTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::gles3::Functional::PackHalf2x16Case::iterate(PackHalf2x16Case *this)

{
  ostringstream *poVar1;
  uint uVar2;
  ShaderExecutor *pSVar3;
  PackHalf2x16Case *pPVar4;
  bool bVar5;
  Float<unsigned_short,_5,_10,_15,_3U> FVar6;
  Float<unsigned_short,_5,_10,_15,_3U> FVar7;
  deUint32 dVar8;
  deBool dVar9;
  deUint32 dVar10;
  int iVar11;
  Float<unsigned_int,_8,_23,_127,_3U> FVar12;
  Float<unsigned_int,_8,_23,_127,_3U> FVar13;
  int iVar14;
  int iVar15;
  char *description;
  float afVar16 [2];
  uint *puVar17;
  long lVar18;
  bool bVar19;
  deUint32 u32;
  void *out;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> inputs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputs;
  Random rnd;
  Vec2 v;
  int local_218;
  Float<unsigned_short,_5,_10,_15,_3U> local_212;
  Hex<8UL> local_210;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_208;
  PackHalf2x16Case *local_1f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e8;
  ulong local_1d0;
  void *local_1c8;
  deRandom local_1c0;
  undefined1 local_1b0 [384];
  
  dVar8 = deStringHash((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_1c0,dVar8 ^ 0x776002);
  local_208.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0._0_4_ = 0.0;
  local_1b0._4_4_ = 0.0;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&local_208,
             (Vector<float,_2> *)local_1b0);
  local_1b0._0_4_ = 0.5;
  local_1b0._4_4_ = 1.0;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&local_208,
             (Vector<float,_2> *)local_1b0);
  local_1b0._0_4_ = 1.0;
  local_1b0._4_4_ = 0.5;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&local_208,
             (Vector<float,_2> *)local_1b0);
  local_1b0._0_4_ = -0.5;
  local_1b0._4_4_ = 1.5;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&local_208,
             (Vector<float,_2> *)local_1b0);
  local_1b0._0_4_ = 0.25;
  local_1b0._4_4_ = 0.75;
  local_1f0 = this;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&local_208,
             (Vector<float,_2> *)local_1b0);
  iVar11 = 0;
  do {
    puVar17 = (uint *)local_1b0;
    local_1b0._0_4_ = 0.0;
    local_1b0._4_4_ = 0.0;
    bVar5 = true;
    do {
      bVar19 = bVar5;
      dVar9 = deRandom_getBool(&local_1c0);
      dVar8 = deRandom_getUint32(&local_1c0);
      dVar10 = deRandom_getUint32(&local_1c0);
      iVar14 = (dVar8 / 0x1e) * -0x1f + dVar8 / 0x1e;
      *puVar17 = (uint)(dVar9 != 1) << 0x1f |
                 (dVar8 + iVar14 + -0xe + (uint)(iVar14 + dVar8 == 0xe)) * 0x800000 + 0x3f800000 |
                 dVar10 & 0x7fffff;
      puVar17 = (uint *)(local_1b0 + 4);
      bVar5 = false;
    } while (bVar19);
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
              (&local_208,(value_type *)local_1b0);
    pPVar4 = local_1f0;
    iVar11 = iVar11 + 1;
  } while (iVar11 != 0x5f);
  afVar16 = (float  [2])
            local_208.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_208.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_208.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_210.value = local_210.value & 0xffffffffffff0000;
      local_1b0._0_4_ = *(float *)afVar16;
      FVar6 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                        ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1b0);
      local_210.value._0_2_ = FVar6.m_value;
      FVar12 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                         ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_210);
      local_212.m_value = 0;
      local_1b0._0_4_ = *(float *)((long)afVar16 + 4);
      local_212 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                            ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1b0);
      FVar13 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>(&local_212);
      *(StorageType *)afVar16 = FVar12.m_value;
      *(StorageType *)((long)afVar16 + 4) = FVar13.m_value;
      afVar16 = (float  [2])((long)afVar16 + 8);
    } while (afVar16 !=
             (float  [2])
             local_208.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_1e8,
             (long)afVar16 -
             (long)local_208.
                   super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_1b0._0_8_ =
       ((pPVar4->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Executing shader for ",0x15)
  ;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," input values",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  local_1b0._0_8_ =
       local_208.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_210.value =
       (deUint64)
       local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (*((pPVar4->super_ShaderPackingFunctionCase).m_executor)->_vptr_ShaderExecutor[5])();
  pSVar3 = (pPVar4->super_ShaderPackingFunctionCase).m_executor;
  (*pSVar3->_vptr_ShaderExecutor[6])
            (pSVar3,(ulong)((long)local_208.
                                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_208.
                                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3,local_1b0,
             &local_210);
  local_1d0 = (ulong)((long)local_208.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_208.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3;
  if ((int)local_1d0 < 1) {
    local_218 = 0;
  }
  else {
    lVar18 = 0;
    local_218 = 0;
    do {
      local_1b0._0_4_ =
           *(float *)&((TestLog *)
                      ((long)local_208.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar18 * 8))->m_log;
      FVar6 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                        ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1b0);
      local_1b0._0_4_ =
           ((StorageType *)
           ((long)local_208.
                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 4))[lVar18 * 2];
      FVar7 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                        ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1b0);
      uVar2 = local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar18];
      local_1c8 = (void *)(ulong)uVar2;
      iVar14 = (uint)FVar6.m_value - (uVar2 & 0xffff);
      iVar11 = -iVar14;
      if (0 < iVar14) {
        iVar11 = iVar14;
      }
      iVar15 = (uint)FVar7.m_value - (uVar2 >> 0x10);
      iVar14 = -iVar15;
      if (0 < iVar15) {
        iVar14 = iVar15;
      }
      if (uVar2 >> 0x10 != (uint)FVar7.m_value || (uVar2 & 0xffff) != (uint)FVar6.m_value) {
        if (local_218 < 10) {
          local_1b0._0_8_ =
               ((local_1f0->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                super_TestNode.m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"ERROR: Mismatch in value ",0x19);
          std::ostream::operator<<(poVar1,(int)lVar18);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,", expected packHalf2x16(",0x18);
          tcu::operator<<((ostream *)poVar1,
                          (Vector<float,_2> *)
                          (lVar18 * 8 +
                          (long)local_208.
                                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                ._M_impl.super__Vector_impl_data._M_start));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") = ",4);
          local_210.value = (deUint64)CONCAT22(FVar7.m_value,FVar6.m_value);
          tcu::Format::Hex<8UL>::toStream(&local_210,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", got ",6);
          local_210.value = (deUint64)local_1c8;
          tcu::Format::Hex<8UL>::toStream(&local_210,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n  diffs = (",0xc);
          std::ostream::operator<<(poVar1,iVar11);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
          std::ostream::operator<<(poVar1,iVar14);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"), max diff = ",0xe)
          ;
          std::ostream::operator<<(poVar1,0);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00658f10:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
          std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
        }
        else if (local_218 == 10) {
          local_1b0._0_8_ =
               ((local_1f0->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),"...",3);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_00658f10;
        }
        local_218 = local_218 + 1;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < (int)((ulong)((long)local_208.
                                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_208.
                                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  pPVar4 = local_1f0;
  local_1b0._0_8_ =
       ((local_1f0->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  iVar11 = (int)local_1d0;
  std::ostream::operator<<(poVar1,iVar11 - local_218);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
  std::ostream::operator<<(poVar1,iVar11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  description = "Pass";
  if (local_218 != 0) {
    description = "Result comparison failed";
  }
  tcu::TestContext::setTestResult
            ((pPVar4->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,(uint)(local_218 != 0),description);
  if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((float  [2])
      local_208.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (float  [2])0x0) {
    operator_delete(local_208.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const int					maxDiff		= 0; // Values can be represented exactly in mediump.
		de::Random					rnd			(deStringHash(getName()) ^ 0x776002);
		std::vector<tcu::Vec2>		inputs;
		std::vector<deUint32>		outputs;

		// Special values to check.
		inputs.push_back(tcu::Vec2(0.0f, 0.0f));
		inputs.push_back(tcu::Vec2(0.5f, 1.0f));
		inputs.push_back(tcu::Vec2(1.0f, 0.5f));
		inputs.push_back(tcu::Vec2(-0.5f, 1.5f));
		inputs.push_back(tcu::Vec2(0.25f, 0.75f));

		// Random values.
		{
			const int	minExp	= -14;
			const int	maxExp	= 15;

			for (int ndx = 0; ndx < 95; ndx++)
			{
				tcu::Vec2 v;
				for (int c = 0; c < 2; c++)
				{
					const int		s			= rnd.getBool() ? 1 : -1;
					const int		exp			= rnd.getInt(minExp, maxExp);
					const deUint32	mantissa	= rnd.getUint32() & ((1<<23)-1);

					v[c] = tcu::Float32::construct(s, exp ? exp : 1 /* avoid denormals */, (1u<<23) | mantissa).asFloat();
				}
				inputs.push_back(v);
			}
		}

		// Convert input values to fp16 and back to make sure they can be represented exactly in mediump.
		for (std::vector<tcu::Vec2>::iterator inVal = inputs.begin(); inVal != inputs.end(); ++inVal)
			*inVal = tcu::Vec2(tcu::Float16(inVal->x()).asFloat(), tcu::Float16(inVal->y()).asFloat());

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->useProgram();
			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deUint16	ref0	= (deUint16)tcu::Float16(inputs[valNdx].x()).bits();
				const deUint16	ref1	= (deUint16)tcu::Float16(inputs[valNdx].y()).bits();
				const deUint32	ref		= (ref1 << 16) | ref0;
				const deUint32	res		= outputs[valNdx];
				const deUint16	res0	= (deUint16)(res & 0xffff);
				const deUint16	res1	= (deUint16)(res >> 16);
				const int		diff0	= de::abs((int)ref0 - (int)res0);
				const int		diff1	= de::abs((int)ref1 - (int)res1);

				if (diff0 > maxDiff || diff1 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx
															   << ", expected packHalf2x16(" << inputs[valNdx] << ") = " << tcu::toHex(ref)
															   << ", got " << tcu::toHex(res)
															   << "\n  diffs = (" << diff0 << ", " << diff1 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									numFailed == 0 ? "Pass"					: "Result comparison failed");
		}

		return STOP;
	}